

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_benchmark.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_5665::Benchmark::Test(Benchmark *this,string *filename)

{
  undefined1 auVar1 [64];
  long lVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  rep rVar5;
  size_t sVar6;
  reference pvVar7;
  long in_RDI;
  undefined8 in_XMM1_Qb;
  undefined1 auVar8 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  rep total_usec;
  size_t solutions_1;
  char *puzzle_1;
  size_t solutions;
  char *puzzle;
  int i;
  microseconds end;
  string *in_stack_00000118;
  Benchmark *in_stack_00000120;
  microseconds start;
  size_t total_solved;
  size_t total_no_guess;
  size_t total_guesses;
  size_t puzzle_guesses;
  char puzzle_output [81];
  bool fast;
  double puzzles_per_second;
  Solver *solver;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Solver,_std::allocator<Solver>_> *__range2;
  vector<int,_std::allocator<int>_> perm;
  size_t in_stack_000002f0;
  size_t in_stack_000002f8;
  double in_stack_00000300;
  size_t in_stack_00000308;
  string *in_stack_00000310;
  Solver *in_stack_00000318;
  Benchmark *in_stack_00000320;
  vector<Solver,_std::allocator<Solver>_> *in_stack_fffffffffffffdf8;
  Util *in_stack_fffffffffffffe00;
  type in_stack_fffffffffffffe08;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  in_stack_fffffffffffffe10;
  duration in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe40;
  Util *in_stack_fffffffffffffe48;
  duration<long,_std::ratio<1L,_1000000L>_> local_170;
  Util *local_168;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_160;
  rep local_158;
  rep local_150;
  size_t local_148;
  reference local_140;
  duration<long,_std::ratio<1L,_1000000L>_> local_138;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_130;
  duration in_stack_fffffffffffffed8;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  in_stack_fffffffffffffee0;
  int local_104;
  duration<long,_std::ratio<1L,_1000000L>_> local_100;
  rep local_f8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_f0;
  rep local_e8;
  rep local_e0;
  ulong local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  undefined1 local_b8 [17];
  undefined1 local_a7 [47];
  undefined1 auStack_78 [17];
  byte local_5d;
  double local_50;
  reference local_48;
  Solver *local_40;
  __normal_iterator<const_Solver_*,_std::vector<Solver,_std::allocator<Solver>_>_> local_38;
  long local_30;
  vector<int,_std::allocator<int>_> local_28;
  
  if (*(long *)(in_RDI + 0x20) != 0) {
    Util::RandomSeed(in_stack_fffffffffffffe00,(uint64_t)in_stack_fffffffffffffdf8);
  }
  Load(in_stack_00000120,in_stack_00000118);
  OutputHeader((Benchmark *)in_stack_fffffffffffffe10.__r,(string *)in_stack_fffffffffffffe08.__r);
  Util::Permutation(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  local_30 = in_RDI + 0x30;
  local_38._M_current =
       (Solver *)std::vector<Solver,_std::allocator<Solver>_>::begin(in_stack_fffffffffffffdf8);
  local_40 = (Solver *)std::vector<Solver,_std::allocator<Solver>_>::end(in_stack_fffffffffffffdf8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Solver_*,_std::vector<Solver,_std::allocator<Solver>_>_>
                             *)in_stack_fffffffffffffe00,
                            (__normal_iterator<const_Solver_*,_std::vector<Solver,_std::allocator<Solver>_>_>
                             *)in_stack_fffffffffffffdf8), bVar4) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_Solver_*,_std::vector<Solver,_std::allocator<Solver>_>_>::
               operator*(&local_38);
    local_50 = WarmupAndEstimateRate
                         ((Benchmark *)in_stack_fffffffffffffee0.__r,
                          (Solver *)in_stack_fffffffffffffed8.__r);
    auVar8._0_8_ = (double)*(int *)(in_RDI + 0x14);
    auVar8._8_8_ = in_XMM1_Qb;
    auVar3 = vcvtusi2sd_avx512f(auVar8,*(undefined8 *)(in_RDI + 8));
    local_5d = auVar3._0_8_ < local_50 * auVar8._0_8_ + local_50 * auVar8._0_8_;
    auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    auStack_78 = auVar1._47_17_;
    auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    local_b8 = auVar1._0_17_;
    local_a7 = auVar1._17_47_;
    local_c8 = 0;
    local_d0 = 0;
    local_d8 = 0;
    local_f0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    in_XMM1_Qb = extraout_XMM1_Qb;
    local_e8 = (rep)std::chrono::
                    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    ::time_since_epoch(&local_f0);
    local_f8 = (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                              ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                               in_stack_fffffffffffffdf8);
    local_e0 = local_f8;
    if ((local_5d & 1) == 0) {
      while( true ) {
        local_138.__r =
             (rep)std::chrono::operator-
                            (in_stack_fffffffffffffe18.__r,in_stack_fffffffffffffe10.__r);
        rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_138);
        if (*(int *)(in_RDI + 0x14) * 2000000 <= rVar5) break;
        lVar2 = *(long *)(in_RDI + 0x50);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_28,local_d8 % *(ulong *)(in_RDI + 8));
        local_140 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x58),
                               lVar2 * *pvVar7);
        local_148 = Solver::Solve((Solver *)in_stack_fffffffffffffe10.__r,
                                  (char *)in_stack_fffffffffffffe08.__r,
                                  (size_t)in_stack_fffffffffffffe00,
                                  (char *)in_stack_fffffffffffffdf8,(size_t *)0x1051db);
        if (((*(byte *)(in_RDI + 0x70) & 1) == 0) && (local_148 == 0)) {
          ExitError((Benchmark *)in_stack_fffffffffffffe10.__r,(char *)in_stack_fffffffffffffe08.__r
                    ,(char *)in_stack_fffffffffffffe00);
        }
        local_c8 = local_c8 + local_c0;
        local_d0 = local_d0 + (ulong)(local_c0 == 0);
        local_d8 = local_d8 + 1;
        local_160.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        in_XMM1_Qb = extraout_XMM1_Qb_01;
        in_stack_fffffffffffffe18 =
             std::chrono::
             time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             ::time_since_epoch(&local_160);
        local_158 = in_stack_fffffffffffffe18.__r;
        in_stack_fffffffffffffe10 =
             std::chrono::
             duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffdf8);
        local_150 = in_stack_fffffffffffffe10.__r;
        local_f8 = in_stack_fffffffffffffe10.__r;
      }
    }
    else {
      while( true ) {
        local_100.__r =
             (rep)std::chrono::operator-
                            (in_stack_fffffffffffffe18.__r,in_stack_fffffffffffffe10.__r);
        rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_100);
        if (*(int *)(in_RDI + 0x14) * 1000000 <= rVar5) break;
        for (local_104 = 0; (ulong)(long)local_104 < *(ulong *)(in_RDI + 8);
            local_104 = local_104 + 1) {
          std::vector<char,_std::allocator<char>_>::operator[]
                    ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x58),
                     *(long *)(in_RDI + 0x50) * (long)local_104);
          sVar6 = Solver::Solve((Solver *)in_stack_fffffffffffffe10.__r,
                                (char *)in_stack_fffffffffffffe08.__r,
                                (size_t)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                                (size_t *)0x104f97);
          if (((*(byte *)(in_RDI + 0x70) & 1) == 0) && (sVar6 == 0)) {
            ExitError((Benchmark *)in_stack_fffffffffffffe10.__r,
                      (char *)in_stack_fffffffffffffe08.__r,(char *)in_stack_fffffffffffffe00);
          }
          local_c8 = local_c0 + local_c8;
          local_d0 = (ulong)(local_c0 == 0) + local_d0;
        }
        local_d8 = local_d8 + *(long *)(in_RDI + 8);
        local_130.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        in_XMM1_Qb = extraout_XMM1_Qb_00;
        in_stack_fffffffffffffed8 =
             std::chrono::
             time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             ::time_since_epoch(&local_130);
        in_stack_fffffffffffffee0 =
             std::chrono::
             duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffdf8);
        local_f8 = in_stack_fffffffffffffee0.__r;
      }
    }
    in_stack_fffffffffffffe08 =
         std::chrono::operator-(in_stack_fffffffffffffe18.__r,in_stack_fffffffffffffe10.__r);
    local_170.__r = in_stack_fffffffffffffe08.__r;
    in_stack_fffffffffffffe00 =
         (Util *)std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_170);
    local_168 = in_stack_fffffffffffffe00;
    OutputResult(in_stack_00000320,in_stack_00000318,in_stack_00000310,in_stack_00000308,
                 in_stack_00000300,in_stack_000002f8,in_stack_000002f0);
    __gnu_cxx::__normal_iterator<const_Solver_*,_std::vector<Solver,_std::allocator<Solver>_>_>::
    operator++(&local_38);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10.__r);
  return;
}

Assistant:

void Test(const string &filename) {
        if (options_.random_seed > 0) {
            util.RandomSeed(options_.random_seed);
        }
        Load(filename);
        OutputHeader(filename);

        // for the slow solvers we'll solve puzzles in this order to avoid any difficulty biases.
        auto perm = util.Permutation(options_.test_dataset_size);

        for (const Solver &solver : options_.solvers) {
            double puzzles_per_second = WarmupAndEstimateRate(solver);
            // we'll use the procedure for fast solvers if we expect to complete a full pass through
            // the data set in less than twice the min test time (or really less than up to 4x the min
            // test time since warmup is run with a limit of 1).
            bool fast = puzzles_per_second * options_.min_seconds_test * 2 > options_.test_dataset_size;

            char puzzle_output[81]{0};
            size_t puzzle_guesses;
            size_t total_guesses = 0;
            size_t total_no_guess = 0;
            size_t total_solved = 0;

            microseconds start = duration_cast<microseconds>(steady_clock::now().time_since_epoch());
            microseconds end = start;

            if (fast) {
                while ((end - start).count() < options_.min_seconds_test * 1000000) {
                    for (int i = 0; i < options_.test_dataset_size; i++) {
                        const char *puzzle = &dataset_[puzzle_buf_size_ * i];
                        size_t solutions = solver.Solve(puzzle, options_.first_solution ? 1 : 2,
                                                        puzzle_output, &puzzle_guesses);
                        if (!allow_zero_ && !solutions) {
                            ExitError(puzzle, "benchmark");
                        }
                        total_guesses += puzzle_guesses;
                        total_no_guess += (puzzle_guesses == 0);
                    }
                    total_solved += options_.test_dataset_size;
                    end = duration_cast<microseconds>(steady_clock::now().time_since_epoch());
                }
            } else {
                while ((end - start).count() < options_.min_seconds_test * 2000000) {
                    const char *puzzle = &dataset_[puzzle_buf_size_ * perm[total_solved % options_.test_dataset_size]];
                    size_t solutions = solver.Solve(puzzle, options_.first_solution ? 1 : 2,
                                                    puzzle_output, &puzzle_guesses);
                    if (!allow_zero_ && !solutions) {
                        ExitError(puzzle, "benchmark");
                    }
                    total_guesses += puzzle_guesses;
                    total_no_guess += (puzzle_guesses == 0);
                    total_solved += 1;
                    end = duration_cast<microseconds>(steady_clock::now().time_since_epoch());
                }
            }

            auto total_usec = (end - start).count();
            OutputResult(solver, filename, total_solved, total_usec, total_guesses, total_no_guess);
        }
    }